

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

void * OPENSSL_calloc(size_t num,size_t size)

{
  undefined1 auVar1 [16];
  size_t size_local;
  size_t num_local;
  
  if ((size == 0) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = size,
     num <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0))) {
    num_local = (size_t)OPENSSL_zalloc(num * size);
  }
  else {
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem.cc"
                  ,0xe7);
    num_local = 0;
  }
  return (void *)num_local;
}

Assistant:

void *OPENSSL_calloc(size_t num, size_t size) {
  if (size != 0 && num > SIZE_MAX / size) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    return NULL;
  }

  return OPENSSL_zalloc(num * size);
}